

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.test.cpp
# Opt level: O3

ostream * operator<<(ostream *out,
                    FlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *map)

{
  pointer ppVar1;
  ostream *this;
  char *pcVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *v;
  pointer ppVar3;
  long lVar4;
  bool bVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"{ ",2);
  ppVar3 = (map->vec_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (map->vec_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar1) {
    lVar4 = 0;
    do {
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
      pcVar2 = ", ";
      if (!bVar5) {
        pcVar2 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar2,(ulong)((uint)bVar5 * 2));
      std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
      this = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(ppVar3->first)._M_dataplus._M_p,(ppVar3->first)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(this,"] -> ",5);
      std::ostream::operator<<(this,ppVar3->second);
      ppVar3 = ppVar3 + 1;
    } while (ppVar3 != ppVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const FlatMap<Key, Value, Compare>& map) {
    out << "{ ";
    size_t i = 0;
    for (const auto& v : map) {
        out << (i++ == 0 ? "" : ", ") << "[" << v.first << "] -> " << v.second;
    }
    return out << " }";
}